

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O0

void do_multiple_register(Am_Object *undo_handler,Am_Object *command_obj,bool copy)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object old_command;
  Am_Object local_48 [3];
  undefined1 local_30 [8];
  Am_Value_List command_list;
  bool copy_local;
  Am_Object *command_obj_local;
  Am_Object *undo_handler_local;
  
  command_list.item._7_1_ = copy;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  Am_Object::Make_Unique(undo_handler,0xc5);
  pAVar2 = Am_Object::Get(undo_handler,0xc5,0);
  Am_Value_List::operator=((Am_Value_List *)local_30,pAVar2);
  if ((command_list.item._7_1_ & 1) != 0) {
    Am_Object::Am_Object(&old_command,command_obj);
    copy_command_tree(local_48);
    Am_Object::operator=(command_obj,local_48);
    Am_Object::~Am_Object(local_48);
    Am_Object::~Am_Object(&old_command);
  }
  bVar1 = Am_Value_List::Empty((Am_Value_List *)local_30);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(command_obj);
    Am_Value_List::Add((Am_Value_List *)local_30,pAVar3,Am_HEAD,true);
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_30);
    Am_Object::Set(undo_handler,0xc5,pAVar3,0);
  }
  else {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(command_obj);
    Am_Value_List::Add((Am_Value_List *)local_30,pAVar3,Am_HEAD,false);
    Am_Object::Note_Changed(undo_handler,0xc5);
  }
  Am_Object::Am_Object(&local_58);
  pAVar2 = Am_Object::Get(undo_handler,0x17a,0);
  Am_Object::operator=(&local_58,pAVar2);
  bVar1 = Am_Object::Valid(&local_58);
  if (bVar1) {
    Am_Object::Am_Object(&local_60,&local_58);
    destroy_command_tree(&local_60);
    Am_Object::~Am_Object(&local_60);
  }
  Am_Object::Set(undo_handler,0x17a,0,0);
  Am_Object::~Am_Object(&local_58);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  return;
}

Assistant:

void
do_multiple_register(Am_Object undo_handler, Am_Object command_obj, bool copy)
{
  Am_Value_List command_list;
  undo_handler.Make_Unique(Am_COMMAND);
  command_list = undo_handler.Get(Am_COMMAND);
  if (copy)
    command_obj = copy_command_tree(command_obj);
  if (command_list.Empty()) {
    command_list.Add(command_obj, Am_HEAD);
    undo_handler.Set(Am_COMMAND, command_list);
  } else {
    // false so don't copy the wrapper object
    command_list.Add(command_obj, Am_HEAD, false);
    undo_handler.Note_Changed(Am_COMMAND);
  }

  // if a pending old_command for Redo, then remove it
  Am_Object old_command;
  old_command = undo_handler.Get(Am_LAST_UNDONE_COMMAND);
  if (old_command.Valid())
    destroy_command_tree(old_command);
  undo_handler.Set(Am_LAST_UNDONE_COMMAND, 0);
}